

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int find_ipv4_start_node(MMDB_s *mmdb)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ushort local_52;
  uint32_t node_count;
  uint16_t netmask;
  uint8_t *record_pointer;
  uint32_t node_value;
  uint8_t *search_tree;
  record_info_s record_info;
  MMDB_s *mmdb_local;
  
  if ((mmdb->ipv4_start_node).node_value == 0) {
    record_info._24_8_ = mmdb;
    record_info_for_database((record_info_s *)&search_tree,mmdb);
    if ((char)record_info.right_record_getter == '\0') {
      mmdb_local._4_4_ = 6;
    }
    else {
      lVar2 = *(long *)(record_info._24_8_ + 0x18);
      record_pointer._4_4_ = 0;
      uVar1 = *(uint *)(record_info._24_8_ + 0x48);
      for (local_52 = 0; local_52 < 0x60 && record_pointer._4_4_ < uVar1; local_52 = local_52 + 1) {
        lVar3 = lVar2 + (ulong)(record_pointer._4_4_ * (ushort)search_tree);
        if (*(ulong *)(record_info._24_8_ + 0x20) < (ulong)(lVar3 + (int)(uint)(ushort)search_tree))
        {
          return 2;
        }
        record_pointer._4_4_ = (*(code *)record_info._0_8_)(lVar3);
      }
      *(uint *)(record_info._24_8_ + 0x44) = record_pointer._4_4_;
      *(ushort *)(record_info._24_8_ + 0x40) = local_52;
      mmdb_local._4_4_ = 0;
    }
  }
  else {
    mmdb_local._4_4_ = 0;
  }
  return mmdb_local._4_4_;
}

Assistant:

static int find_ipv4_start_node(MMDB_s *const mmdb) {
    /* In a pathological case of a database with a single node search tree,
     * this check will be true even after we've found the IPv4 start node, but
     * that doesn't seem worth trying to fix. */
    if (mmdb->ipv4_start_node.node_value != 0) {
        return MMDB_SUCCESS;
    }

    record_info_s record_info = record_info_for_database(mmdb);
    if (record_info.right_record_offset == 0) {
        return MMDB_UNKNOWN_DATABASE_FORMAT_ERROR;
    }

    const uint8_t *search_tree = mmdb->file_content;
    uint32_t node_value = 0;
    const uint8_t *record_pointer;
    uint16_t netmask;
    uint32_t node_count = mmdb->metadata.node_count;

    for (netmask = 0; netmask < 96 && node_value < node_count; netmask++) {
        record_pointer = &search_tree[node_value * record_info.record_length];
        if (record_pointer + record_info.record_length > mmdb->data_section) {
            return MMDB_CORRUPT_SEARCH_TREE_ERROR;
        }
        node_value = record_info.left_record_getter(record_pointer);
    }

    mmdb->ipv4_start_node.node_value = node_value;
    mmdb->ipv4_start_node.netmask = netmask;

    return MMDB_SUCCESS;
}